

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExpressionStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ExpressionStatement,slang::ast::Expression_const&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,SourceRange *args_1)

{
  SourceRange sourceRange;
  ExpressionStatement *pEVar1;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pEVar1 = (ExpressionStatement *)
           allocate((BumpAllocator *)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  sourceRange.endLoc = in_RSI;
  sourceRange.startLoc = in_RDX;
  ast::ExpressionStatement::ExpressionStatement
            (*(ExpressionStatement **)((long)in_RDX + 8),*(Expression **)in_RDX,sourceRange);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }